

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

string * __thiscall
pstore::file::system_error::message<std::__cxx11::string>
          (string *__return_storage_ptr__,system_error *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *user_message,
          string *path)

{
  ostream *poVar1;
  ostringstream stream;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
  std::operator<<((ostream *)&stream,(string *)user_message);
  if (path->_M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)&stream," \"");
    poVar1 = std::operator<<(poVar1,(string *)path);
    std::operator<<(poVar1,'\"');
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

std::string system_error::message (MessageStringType const & user_message,
                                           std::string const & path) {
            std::ostringstream stream;
            stream << user_message;
            if (path.length () > 0) {
                stream << " \"" << path << '\"';
            }
            return stream.str ();
        }